

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_DrawPSprite
               (DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
               double ticfrac)

{
  visstyle_t *pvVar1;
  vissprite_t *vis;
  float fVar2;
  ushort uVar3;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  AInventory *pAVar4;
  lighttable_t *plVar5;
  undefined1 auVar6 [16];
  vissprite_t *pvVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  PalEntry fade;
  AWeapon *pAVar12;
  FDynamicColormap *pFVar13;
  short sVar14;
  long lVar15;
  short sVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  FDynamicColormap *pFVar21;
  uint uVar22;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  DObject *p;
  FTexture *pFVar23;
  lighttable_t *oldcolormap;
  lighttable_t *plVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  int iVar28;
  double dVar29;
  double dVar30;
  FRenderStyle style;
  FRenderStyle local_34;
  
  if (R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') {
    R_DrawPSprite();
  }
  if (R_DrawPSprite::avis.Count < vispspindex + 1) {
    uVar22 = (R_DrawPSprite::avis.Count - vispspindex) + 1;
    TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::Grow(&R_DrawPSprite::avis,uVar22);
    R_DrawPSprite::avis.Count = R_DrawPSprite::avis.Count + uVar22;
  }
  uVar22 = pspr->Sprite;
  if (sprites.Count <= uVar22) {
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n");
    return;
  }
  if ((int)(uint)sprites.Array[(int)uVar22].numframes <= pspr->Frame) {
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n");
    return;
  }
  lVar15 = (long)pspr->Frame + (ulong)sprites.Array[(int)uVar22].spriteframes;
  uVar20 = (ulong)SpriteFrames.Array[lVar15].Texture[0].texnum;
  if (uVar20 < TexMan.Textures.Count) {
    pFVar23 = TexMan.Textures.Array[TexMan.Translation.Array[uVar20]].Texture;
  }
  else {
    pFVar23 = (FTexture *)0x0;
  }
  if (pFVar23->UseType == '\r') {
    return;
  }
  uVar3 = SpriteFrames.Array[lVar15].Flip;
  if (pspr->firstTic == false) {
    dVar27 = pspr->x;
    dVar29 = pspr->y;
    dVar25 = pspr->oldx;
    dVar30 = pspr->oldy;
  }
  else {
    pspr->firstTic = false;
    dVar27 = pspr->x;
    dVar29 = pspr->y;
    pspr->oldx = dVar27;
    pspr->oldy = dVar29;
    dVar25 = dVar27;
    dVar30 = dVar29;
  }
  pvVar7 = R_DrawPSprite::avis.Array;
  iVar28 = -(uint)((pspr->Flags & 2U) == 0);
  auVar26._4_4_ = iVar28;
  auVar26._0_4_ = iVar28;
  auVar26._8_4_ = iVar28;
  auVar26._12_4_ = iVar28;
  auVar6._8_8_ = (double)boby;
  auVar6._0_8_ = (double)bobx;
  dVar25 = SUB168(~auVar26 & auVar6,0) + ticfrac * (dVar27 - dVar25) + dVar25;
  dVar27 = SUB168(~auVar26 & auVar6,8) + ticfrac * (dVar29 - dVar30) + dVar30 + 0.375;
  if (((pspr->Flags & 1U) != 0) && (pspr->ID != 1)) {
    dVar25 = dVar25 + wx;
    dVar27 = dVar27 + wy;
  }
  dVar29 = (pFVar23->Scale).X;
  uVar22 = (uint)((double)(pFVar23->LeftOffset * 2) / dVar29);
  dVar25 = (dVar25 + -160.0) - (double)(int)((uVar22 & 1) + ((int)uVar22 >> 1));
  dVar30 = dVar25 * pspritexscale + CenterX + 6755399441055744.0;
  iVar28 = SUB84(dVar30,0);
  if (viewwidth < iVar28) {
    return;
  }
  uVar22 = (uint)((double)((uint)pFVar23->Width * 2) / dVar29);
  dVar29 = CenterX + 6755399441055744.0 +
           (dVar25 + (double)(int)((uVar22 & 1) + ((int)uVar22 >> 1))) * pspritexscale;
  iVar17 = SUB84(dVar29,0);
  if (iVar17 < 1) {
    return;
  }
  uVar20 = (ulong)vispspindex;
  vis = R_DrawPSprite::avis.Array + uVar20;
  R_DrawPSprite::avis.Array[uVar20].renderflags = (short)(owner->renderflags).Value;
  pvVar7[uVar20].floorclip = 0.0;
  pvVar7[uVar20].field_14.field_0.texturemid =
       (double)(int)pFVar23->TopOffset + (100.0 - dVar27) * (pFVar23->Scale).Y;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen || (viewheight == RenderTarget->Height)) ||
      ((0x140 < RenderTarget->Width && (st_scale.Value == false)))))) {
    p = (pspr->Caller).field_0.o;
    if (p == (DObject *)0x0) {
LAB_002ef2fe:
      p = (DObject *)0x0;
    }
    else if ((p->ObjectFlags & 0x20) != 0) {
      (pspr->Caller).field_0.p = (AActor *)0x0;
      goto LAB_002ef2fe;
    }
    pAVar12 = dyn_cast<AWeapon>(p);
    if ((pAVar12 != (AWeapon *)0x0) && (fVar2 = pAVar12->YAdjust, fVar2 != 0.0)) {
      if (((DFrameBuffer *)RenderTarget == screen) && (viewheight != RenderTarget->Height)) {
        dVar27 = (double)fVar2 * StatusBar->Displacement;
      }
      else {
        dVar27 = (double)fVar2;
      }
      (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar27;
    }
  }
  if (pspr->ID < 0x7ffffffd) {
    dVar27 = AspectPspriteOffset(WidescreenRatio);
    (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar27;
  }
  iVar10 = 0;
  sVar14 = 0;
  if (0 < iVar28) {
    sVar14 = SUB82(dVar30,0);
  }
  vis->x1 = sVar14;
  sVar16 = (short)viewwidth;
  if (iVar17 < viewwidth) {
    sVar16 = SUB82(dVar29,0);
  }
  vis->x2 = sVar16;
  vis->xscale = SUB84(pspritexscale / (pFVar23->Scale).X + 103079215104.0,0);
  vis->yscale = (float)(pspriteyscale / (pFVar23->Scale).Y);
  vis->Translation = 0;
  (vis->field_13).pic = pFVar23;
  vis->ColormapNum = '\0';
  iVar17 = SUB84((pFVar23->Scale).X * pspritexiscale + 103079215104.0,0);
  if (((uint)pspr->Flags >> 6 & 1) == (uVar3 & 1 ^ 1)) {
    iVar17 = -iVar17;
    (vis->field_14).field_0.xiscale = iVar17;
    iVar10 = *(int *)&pFVar23->Width * 0x10000 + -1;
  }
  else {
    (vis->field_14).field_0.xiscale = iVar17;
  }
  iVar18 = 0;
  if (iVar28 < sVar14) {
    iVar18 = (sVar14 - iVar28) * iVar17;
  }
  (vis->field_14).field_0.startfrac = iVar18 + iVar10;
  pFVar13 = basecolormap;
  if (pspr->ID < 0x7ffffffd) {
    (vis->Style).Alpha = (float)owner->Alpha;
    uVar22 = (owner->RenderStyle).AsDWORD;
    uVar19 = uVar22 >> 0x18 & 0x20;
    uVar11 = uVar19 >> 5 ^ 1;
    if ((uVar22 >> 0x1c & 1) == 0) {
      uVar11 = uVar19;
    }
    (vis->Style).RenderStyle.AsDWORD = uVar22;
    pFVar13 = basecolormap;
    if ((uVar22 >> 0x1e & 1) != 0) {
      fade_00.d = 0xffffff;
      if (uVar11 == 0) {
        fade_00.d = 0;
      }
      pFVar13 = GetSpecialLights((PalEntry)(basecolormap->Color).field_0.field_0,(PalEntry)fade_00,
                                 basecolormap->Desaturate);
      uVar11 = 0;
    }
    pvVar1 = &vis->Style;
    if (realfixedcolormap == 0) {
      if (uVar11 != 0) {
        color = (pFVar13->Color).field_0.field_0;
        fade = PalEntry::InverseColor(&pFVar13->Fade);
        pFVar13 = GetSpecialLights((PalEntry)color,fade,pFVar13->Desaturate);
      }
      if ((long)fixedlightlev < 0) {
        if ((foggy == '\0') && ((pspr->State->StateFlags & 4) != 0)) {
          pFVar21 = pFVar13;
          if (r_fullbrightignoresectorcolor.Value != false) {
            pFVar21 = &FullNormalLight;
          }
          plVar24 = pFVar21->Maps;
        }
        else {
          iVar17 = 0x1f;
          if (spriteshade._2_2_ < 0x1f) {
            iVar17 = (int)spriteshade._2_2_;
          }
          iVar10 = 0;
          if (0 < iVar17) {
            iVar10 = iVar17;
          }
          plVar24 = pFVar13->Maps + (uint)(iVar10 << 8);
        }
      }
      else {
        pFVar21 = pFVar13;
        if (r_fullbrightignoresectorcolor.Value != false) {
          pFVar21 = &FullNormalLight;
        }
        plVar24 = pFVar21->Maps + fixedlightlev;
      }
    }
    else {
      plVar24 = (lighttable_t *)(realfixedcolormap + 0x18);
    }
    pvVar1->colormap = plVar24;
    pAVar4 = (camera->Inventory).field_0.p;
    if (pAVar4 == (AInventory *)0x0) {
LAB_002ef681:
      bVar8 = false;
    }
    else {
      if (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
        (camera->Inventory).field_0.p = (AInventory *)0x0;
        goto LAB_002ef681;
      }
      (*(pAVar4->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2e])(pAVar4,pvVar1);
      plVar5 = pvVar1->colormap;
      if (plVar5 == plVar24) {
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if (((SpecialColormaps.Array)->Colormap <= plVar5) &&
           (plVar5 <= SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap)) {
          bVar8 = pFVar13->Maps + 0x2000 <= plVar5 || plVar5 < pFVar13->Maps;
        }
      }
    }
    bVar9 = bVar8;
    if (((r_shadercolormaps.Value == false) &&
        ((SpecialColormaps.Array)->Colormap <= pvVar1->colormap)) &&
       (bVar9 = true, SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap < pvVar1->colormap
       )) {
      bVar9 = bVar8;
    }
    bVar8 = true;
    if (NormalLight.Maps == realcolormaps) {
      bVar8 = bVar9;
    }
    if (pFVar13 == &NormalLight) {
      bVar9 = bVar8;
    }
    if (((!bVar9) && (realfixedcolormap == 0)) &&
       ((pFVar13 == &NormalLight && ((NormalLightHasFixedLights & 1U) != 0)))) {
      iVar17 = (*((vis->field_13).pic)->_vptr_FTexture[5])();
      bVar9 = true;
      if ((char)iVar17 == '\0') {
        bVar9 = bVar8;
      }
    }
    pFVar21 = pFVar13;
    if (-1 < fixedlightlev) {
      pFVar21 = &FullNormalLight;
    }
    if (r_fullbrightignoresectorcolor.Value != false) {
      pFVar13 = pFVar21;
    }
    if (((r_fullbrightignoresectorcolor.Value == true) && (foggy == '\0')) &&
       ((pspr->State->StateFlags & 4) != 0)) {
      pFVar13 = &FullNormalLight;
    }
    if (bVar9) goto LAB_002ef789;
  }
  else {
    (vis->Style).colormap = basecolormap->Maps;
    (vis->Style).RenderStyle = LegacyRenderStyles[1];
  }
  if (((DFrameBuffer *)RenderTarget == screen) && (screen->Accel2D != false)) {
    local_34 = (FRenderStyle)*(FRenderStyle *)&(vis->Style).RenderStyle.field_0;
    FRenderStyle::CheckFuzz(&local_34);
    if (local_34.field_0.BlendOp != '\x04') {
      if (DAT_017a6bac < vispspindex + 1) {
        uVar22 = (DAT_017a6bac - vispspindex) + 1;
        TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::Grow
                  ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)&vispsprites,uVar22);
        DAT_017a6bac = DAT_017a6bac + uVar22;
      }
      lVar15 = vispsprites;
      uVar20 = (ulong)vispspindex;
      *(vissprite_t **)(vispsprites + uVar20 * 0x18) = vis;
      *(FDynamicColormap **)(lVar15 + 8 + uVar20 * 0x18) = pFVar13;
      *(int *)(lVar15 + 0x10 + uVar20 * 0x18) = iVar28;
      vispspindex = vispspindex + 1;
      return;
    }
  }
LAB_002ef789:
  R_DrawVisSprite(vis);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac + WEAPON_FUDGE_Y;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= AspectPspriteOffset(WidescreenRatio);
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (!(flip) != !(pspr->Flags & PSPF_FLIP))
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? (FullNormalLight.Maps + fixedlightlev) : (mybasecolormap->Maps + fixedlightlev);
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		// [SP] If emulating GZDoom fullbright, disable acceleration
		if (r_fullbrightignoresectorcolor && fixedlightlev >= 0)
			mybasecolormap = &FullNormalLight;
		if (r_fullbrightignoresectorcolor && !foggy && pspr->GetState()->GetFullbright())
			mybasecolormap = &FullNormalLight;
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}